

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O2

void __thiscall
GlobOpt::SetPathDependentInfo(GlobOpt *this,bool conditionToBranch,PathDependentInfo *info)

{
  Instr *pIVar1;
  SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *pSVar2;
  code *pcVar3;
  GlobOpt *pGVar4;
  bool bVar5;
  BOOL BVar6;
  uint sourceContextId;
  uint functionId;
  undefined4 *puVar7;
  BasicBlock *pBVar8;
  Type *ppFVar9;
  Iterator local_48;
  GlobOpt *local_38;
  
  pBVar8 = this->currentBlock;
  if ((pBVar8->succList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>.
      super_RealCount.count == 2) {
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x28a6,"(this->currentBlock->GetSuccList()->Count() == 2)",
                       "this->currentBlock->GetSuccList()->Count() == 2");
    if (!bVar5) goto LAB_0043b791;
    *puVar7 = 0;
    pBVar8 = this->currentBlock;
  }
  pBVar8 = BasicBlock::GetNext(pBVar8);
  pIVar1 = pBVar8->firstInstr;
  local_48.list =
       &(this->currentBlock->succList).
        super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>;
  local_48.current = &(local_48.list)->super_SListNodeBase<Memory::ArenaAllocator>;
  local_38 = this;
  while( true ) {
    if ((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)local_48.current ==
        (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar7 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                         ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar5) goto LAB_0043b791;
      *puVar7 = 0;
    }
    pGVar4 = local_38;
    pSVar2 = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
             (((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)&(local_48.current)->next
              )->super_SListNodeBase<Memory::ArenaAllocator>).next;
    if (pSVar2 == local_48.list) break;
    local_48.current = (NodeBase *)pSVar2;
    ppFVar9 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data(&local_48);
    if (((*ppFVar9)->succBlock->firstInstr == pIVar1) != conditionToBranch) {
      FlowEdge::SetPathDependentInfo(*ppFVar9,info,local_38->alloc);
      return;
    }
  }
  BVar6 = Func::HasTry(local_38->func);
  if (BVar6 != 0) {
    return;
  }
  sourceContextId = Func::GetSourceContextId(pGVar4->func);
  functionId = Func::GetLocalFunctionId(pGVar4->func);
  bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_01441eb0,FGPeepsPhase,sourceContextId,functionId);
  if (bVar5) {
    return;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  *puVar7 = 1;
  bVar5 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                     ,0x28b3,
                     "(this->func->HasTry() || Js::Configuration::Global.flags.Off.IsEnabled(((Js::FGPeepsPhase)), ((this->func)->GetSourceContextId()), ((this->func)->GetLocalFunctionId())))"
                     ,"this->func->HasTry() || PHASE_OFF(Js::FGPeepsPhase, this->func)");
  if (bVar5) {
    *puVar7 = 0;
    return;
  }
LAB_0043b791:
  pcVar3 = (code *)invalidInstructionException();
  (*pcVar3)();
}

Assistant:

void
GlobOpt::SetPathDependentInfo(const bool conditionToBranch, const PathDependentInfo &info)
{
    Assert(this->currentBlock->GetSuccList()->Count() == 2);
    IR::Instr * fallthrough = this->currentBlock->GetNext()->GetFirstInstr();
    FOREACH_SLISTBASECOUNTED_ENTRY(FlowEdge*, edge, this->currentBlock->GetSuccList())
    {
        if (conditionToBranch == (edge->GetSucc()->GetFirstInstr() != fallthrough))
        {
            edge->SetPathDependentInfo(info, alloc);
            return;
        }
    }
    NEXT_SLISTBASECOUNTED_ENTRY;

    // In case flowgraph peeps is disabled, we could have conditional branch to next instr
    Assert(this->func->HasTry() || PHASE_OFF(Js::FGPeepsPhase, this->func));
}